

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall
QGraphicsScene::wheelEvent(QGraphicsScene *this,QGraphicsSceneWheelEvent *wheelEvent)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Int IVar4;
  FocusPolicy FVar5;
  const_iterator other;
  QGraphicsWidget **ppQVar6;
  QGraphicsItem **ppQVar7;
  QGraphicsItemPrivate *pQVar8;
  QGraphicsScenePrivate *__addr_len;
  sockaddr *__addr;
  int __fd;
  QWidget *in_RSI;
  QGraphicsWidget *in_RDI;
  long in_FS_OFFSET;
  bool ret;
  bool isPanel;
  QGraphicsItem *item;
  QList<QGraphicsItem_*> *__range1;
  bool hasSetFocus;
  QGraphicsScenePrivate *d;
  const_iterator __end1;
  const_iterator __begin1;
  const_iterator iter;
  QList<QGraphicsItem_*> wheelCandidates;
  undefined4 in_stack_fffffffffffffec8;
  GraphicsItemFlag in_stack_fffffffffffffecc;
  QGraphicsItemPrivate *in_stack_fffffffffffffed0;
  FocusReason focusReason;
  QWidget *in_stack_fffffffffffffed8;
  QGraphicsScenePrivate *in_stack_fffffffffffffee0;
  QGraphicsItemPrivate *in_stack_fffffffffffffee8;
  QGraphicsScenePrivate *in_stack_fffffffffffffef0;
  undefined6 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffefe;
  undefined1 uVar9;
  QWidget *in_stack_ffffffffffffff10;
  QGraphicsScenePrivate *pQVar10;
  QPointF *in_stack_ffffffffffffff18;
  QGraphicsWidget *pQVar11;
  QPoint *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  byte bVar12;
  QPointF local_70;
  QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4> local_60;
  QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4> local_5c;
  QGraphicsItem **local_58;
  const_iterator local_50;
  const_iterator local_48;
  const_iterator local_40;
  QPointF local_38;
  QPoint local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QGraphicsScene *)0x9d318e);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = QGraphicsSceneWheelEvent::screenPos
                       ((QGraphicsSceneWheelEvent *)in_stack_fffffffffffffed0);
  local_38 = QGraphicsSceneWheelEvent::scenePos
                       ((QGraphicsSceneWheelEvent *)in_stack_fffffffffffffed8);
  QGraphicsSceneEvent::widget((QGraphicsSceneEvent *)0x9d3211);
  __addr_len = (QGraphicsScenePrivate *)&local_38;
  QGraphicsScenePrivate::itemsAtPosition
            ((QGraphicsScenePrivate *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
             in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  local_40.i = (QGraphicsWidget **)&DAT_aaaaaaaaaaaaaaaa;
  local_40 = QList<QGraphicsWidget_*>::constEnd
                       ((QList<QGraphicsWidget_*> *)in_stack_fffffffffffffed0);
  while( true ) {
    other = QList<QGraphicsWidget_*>::constBegin
                      ((QList<QGraphicsWidget_*> *)in_stack_fffffffffffffed0);
    bVar1 = QList<QGraphicsWidget_*>::const_iterator::operator>(&local_40,other);
    __addr_len = (QGraphicsScenePrivate *)CONCAT71((int7)((ulong)__addr_len >> 8),bVar1);
    bVar12 = 0;
    if (bVar1) {
      bVar1 = QList<QGraphicsItem_*>::isEmpty((QList<QGraphicsItem_*> *)0x9d32ae);
      bVar12 = bVar1 ^ 0xff;
    }
    if ((bVar12 & 1) == 0) break;
    QList<QGraphicsWidget_*>::const_iterator::operator--(&local_40);
    ppQVar7 = QList<QGraphicsItem_*>::first((QList<QGraphicsItem_*> *)in_stack_fffffffffffffed0);
    pQVar10 = (QGraphicsScenePrivate *)*ppQVar7;
    ppQVar6 = QList<QGraphicsWidget_*>::const_iterator::operator*(&local_40);
    pQVar11 = *ppQVar6;
    __addr_len = (QGraphicsScenePrivate *)0x0;
    if (pQVar11 != (QGraphicsWidget *)0x0) {
      __addr_len = (QGraphicsScenePrivate *)&(pQVar11->super_QGraphicsObject).super_QGraphicsItem;
    }
    if (pQVar10 == __addr_len) break;
    pQVar10 = __addr_len;
    QList<QGraphicsWidget_*>::const_iterator::operator*(&local_40);
    uVar9 = (undefined1)((ulong)pQVar11 >> 0x38);
    QList<QGraphicsItem_*>::first((QList<QGraphicsItem_*> *)in_stack_fffffffffffffed0);
    bVar1 = QGraphicsItem::isAncestorOf
                      ((QGraphicsItem *)in_stack_fffffffffffffee8,
                       (QGraphicsItem *)in_stack_fffffffffffffee0);
    if (bVar1) break;
    QList<QGraphicsWidget_*>::const_iterator::operator*(&local_40);
    QGraphicsScenePrivate::removePopup(pQVar10,in_RDI,(bool)uVar9);
  }
  bVar1 = false;
  local_48.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
  local_48 = QList<QGraphicsItem_*>::begin((QList<QGraphicsItem_*> *)in_stack_fffffffffffffed0);
  local_50.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
  local_50 = QList<QGraphicsItem_*>::end((QList<QGraphicsItem_*> *)in_stack_fffffffffffffed0);
  while( true ) {
    local_58 = local_50.i;
    bVar2 = QList<QGraphicsItem_*>::const_iterator::operator!=(&local_48,local_50);
    if (!bVar2) break;
    ppQVar7 = QList<QGraphicsItem_*>::const_iterator::operator*(&local_48);
    pQVar10 = (QGraphicsScenePrivate *)*ppQVar7;
    uVar9 = false;
    if (!bVar1) {
      bVar2 = QGraphicsItem::isEnabled((QGraphicsItem *)0x9d3464);
      __addr_len = (QGraphicsScenePrivate *)CONCAT71((int7)((ulong)__addr_len >> 8),bVar2);
      uVar9 = false;
      if (bVar2) {
        local_60.super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i =
             (QFlagsStorage<QGraphicsItem::GraphicsItemFlag>)
             QGraphicsItem::flags((QGraphicsItem *)in_stack_fffffffffffffed0);
        local_5c.super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i =
             (QFlagsStorage<QGraphicsItem::GraphicsItemFlag>)
             QFlags<QGraphicsItem::GraphicsItemFlag>::operator&
                       ((QFlags<QGraphicsItem::GraphicsItemFlag> *)in_stack_fffffffffffffed0,
                        in_stack_fffffffffffffecc);
        IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_5c);
        __addr_len = (QGraphicsScenePrivate *)(ulong)IVar4;
        in_stack_fffffffffffffefe = false;
        uVar9 = in_stack_fffffffffffffefe;
        if (IVar4 != 0) {
          pQVar8 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                   ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                                 *)&pQVar10->field_0x8);
          in_stack_fffffffffffffefe = (*(uint *)&pQVar8->field_0x168 >> 1 & 1) != 0;
          uVar9 = in_stack_fffffffffffffefe;
        }
      }
    }
    if (((bool)uVar9 != false) &&
       (bVar2 = QGraphicsItem::isWidget((QGraphicsItem *)0x9d3502), bVar2)) {
      if (pQVar10 == (QGraphicsScenePrivate *)0x0) {
        in_stack_fffffffffffffee8 = (QGraphicsItemPrivate *)0x0;
      }
      else {
        in_stack_fffffffffffffee8 = (QGraphicsItemPrivate *)&pQVar10[-1].modalPanels.d.ptr;
      }
      in_stack_fffffffffffffef0 = pQVar10;
      FVar5 = QGraphicsWidget::focusPolicy((QGraphicsWidget *)in_stack_fffffffffffffed0);
      focusReason = (FocusReason)((ulong)in_stack_fffffffffffffed0 >> 0x20);
      if (FVar5 == WheelFocus) {
        bVar1 = true;
        in_stack_fffffffffffffee0 = pQVar10;
        __addr_len = (QGraphicsScenePrivate *)focusItem((QGraphicsScene *)pQVar10);
        if (in_stack_fffffffffffffee0 != __addr_len) {
          setFocusItem((QGraphicsScene *)in_stack_fffffffffffffee0,
                       (QGraphicsItem *)in_stack_fffffffffffffed8,focusReason);
        }
      }
    }
    in_stack_fffffffffffffed8 = in_RSI;
    in_stack_fffffffffffffed0 =
         QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
         operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                     *)&pQVar10->field_0x8);
    QGraphicsSceneWheelEvent::scenePos((QGraphicsSceneWheelEvent *)in_stack_fffffffffffffed8);
    QGraphicsSceneEvent::widget((QGraphicsSceneEvent *)0x9d35d6);
    local_70 = QGraphicsItemPrivate::genericMapFromScene
                         (in_stack_fffffffffffffee8,(QPointF *)in_stack_fffffffffffffee0,
                          in_stack_fffffffffffffed8);
    __fd = (int)&local_70;
    QGraphicsSceneWheelEvent::setPos
              ((QGraphicsSceneWheelEvent *)in_stack_fffffffffffffed0,
               (QPointF *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    QEvent::accept((QEvent *)in_RSI,__fd,__addr,(socklen_t *)__addr_len);
    bVar2 = QGraphicsItem::isPanel((QGraphicsItem *)0x9d3629);
    bVar3 = QGraphicsScenePrivate::sendEvent
                      ((QGraphicsScenePrivate *)
                       CONCAT17(uVar9,CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8))
                       ,(QGraphicsItem *)in_stack_fffffffffffffef0,
                       (QEvent *)in_stack_fffffffffffffee8);
    if ((bVar3) && ((bVar2 || (bVar2 = QEvent::isAccepted((QEvent *)in_RSI), bVar2)))) break;
    QList<QGraphicsItem_*>::const_iterator::operator++(&local_48);
  }
  QList<QGraphicsItem_*>::~QList((QList<QGraphicsItem_*> *)0x9d3696);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScene::wheelEvent(QGraphicsSceneWheelEvent *wheelEvent)
{
    Q_D(QGraphicsScene);
    const QList<QGraphicsItem *> wheelCandidates = d->itemsAtPosition(wheelEvent->screenPos(),
                                                                      wheelEvent->scenePos(),
                                                                      wheelEvent->widget());

    // Find the first popup under the mouse (including the popup's descendants) starting from the last.
    // Remove all popups after the one found, or all or them if no popup is under the mouse.
    // Then continue with the event.
    QList<QGraphicsWidget *>::const_iterator iter = d->popupWidgets.constEnd();
    while (iter > d->popupWidgets.constBegin() && !wheelCandidates.isEmpty()) {
        --iter;
        if (wheelCandidates.first() == *iter || (*iter)->isAncestorOf(wheelCandidates.first()))
            break;
        d->removePopup(*iter);
    }

    bool hasSetFocus = false;
    for (QGraphicsItem *item : wheelCandidates) {
        if (!hasSetFocus && item->isEnabled()
            && ((item->flags() & QGraphicsItem::ItemIsFocusable) && item->d_ptr->mouseSetsFocus)) {
            if (item->isWidget() && static_cast<QGraphicsWidget *>(item)->focusPolicy() == Qt::WheelFocus) {
                hasSetFocus = true;
                if (item != focusItem())
                    setFocusItem(item, Qt::MouseFocusReason);
            }
        }

        wheelEvent->setPos(item->d_ptr->genericMapFromScene(wheelEvent->scenePos(),
                                                            wheelEvent->widget()));
        wheelEvent->accept();
        bool isPanel = item->isPanel();
        bool ret = d->sendEvent(item, wheelEvent);

        if (ret && (isPanel || wheelEvent->isAccepted()))
            break;
    }
}